

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsStyle.cxx
# Opt level: O0

void DisableFeature(char *name)

{
  bool bVar1;
  int iVar2;
  iterator __lhs;
  char *__s1;
  reference pkVar3;
  char *in_RDI;
  iterator it;
  iterator in_stack_ffffffffffffffe8;
  
  __lhs = std::vector<kwsFeature,_std::allocator<kwsFeature>_>::begin
                    (in_stack_ffffffffffffffe8._M_current);
  while( true ) {
    in_stack_ffffffffffffffe8 =
         std::vector<kwsFeature,_std::allocator<kwsFeature>_>::end
                   (in_stack_ffffffffffffffe8._M_current);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<kwsFeature_*,_std::vector<kwsFeature,_std::allocator<kwsFeature>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<kwsFeature_*,_std::vector<kwsFeature,_std::allocator<kwsFeature>_>_>
                        *)in_stack_ffffffffffffffe8._M_current);
    if (!bVar1) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<kwsFeature_*,_std::vector<kwsFeature,_std::allocator<kwsFeature>_>_>::
    operator*((__normal_iterator<kwsFeature_*,_std::vector<kwsFeature,_std::allocator<kwsFeature>_>_>
               *)&stack0xfffffffffffffff0);
    __s1 = (char *)std::__cxx11::string::c_str();
    iVar2 = strcmp(__s1,in_RDI);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<kwsFeature_*,_std::vector<kwsFeature,_std::allocator<kwsFeature>_>_>::
    operator++((__normal_iterator<kwsFeature_*,_std::vector<kwsFeature,_std::allocator<kwsFeature>_>_>
                *)&stack0xfffffffffffffff0);
  }
  pkVar3 = __gnu_cxx::
           __normal_iterator<kwsFeature_*,_std::vector<kwsFeature,_std::allocator<kwsFeature>_>_>::
           operator*((__normal_iterator<kwsFeature_*,_std::vector<kwsFeature,_std::allocator<kwsFeature>_>_>
                      *)&stack0xfffffffffffffff0);
  pkVar3->enable = false;
  return;
}

Assistant:

static void DisableFeature(const char* name)
{
  auto it = features.begin();
  while(it != features.end())
    {
    if(!strcmp((*it).name.c_str(),name))
      {
      (*it).enable = false;
      return;
      }
    ++it;
    }
}